

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-poll.c
# Opt level: O3

int run_test_fs_poll_close_request_multi_start_stop(void)

{
  int iVar1;
  int iVar2;
  int extraout_EAX;
  code *unaff_RBX;
  uint uVar3;
  ulong unaff_RBP;
  char *unaff_R14;
  uv_fs_poll_t *unaff_R15;
  int64_t eval_b;
  int64_t eval_b_1;
  uv_fs_poll_t poll_handle;
  uv_loop_t loop;
  uv_fs_poll_t uStack_ac8;
  uv_loop_t uStack_a80;
  uv_loop_t *puStack_758;
  long lStack_748;
  long lStack_740;
  undefined1 auStack_738 [880];
  uv_loop_t *puStack_3c8;
  char *pcStack_3c0;
  uv_fs_poll_t *puStack_3b8;
  code *pcStack_3b0;
  long local_3a0;
  long local_398;
  uv_fs_poll_t local_390;
  uv_loop_t local_348;
  
  pcStack_3b0 = (code *)0x187539;
  remove("testfile");
  pcStack_3b0 = (code *)0x187543;
  iVar1 = uv_loop_init(&local_348);
  local_390.data = (void *)(long)iVar1;
  local_3a0 = 0;
  if (local_390.data == (void *)0x0) {
    pcStack_3b0 = (code *)0x187572;
    iVar1 = uv_fs_poll_init(&local_348,&local_390);
    local_3a0 = (long)iVar1;
    local_398 = 0;
    if (local_3a0 != 0) goto LAB_001876e6;
    unaff_RBP = 10;
    unaff_RBX = poll_cb_fail;
    unaff_R14 = "testfile";
    unaff_R15 = &local_390;
    do {
      local_3a0 = 0;
      local_398 = 0;
      pcStack_3b0 = (code *)0x1875bd;
      iVar1 = uv_fs_poll_start(unaff_R15,poll_cb_fail,"testfile",100);
      local_3a0 = (long)iVar1;
      local_398 = 0;
      if (local_3a0 != 0) {
LAB_001876c8:
        pcStack_3b0 = (code *)0x1876d7;
        run_test_fs_poll_close_request_multi_start_stop_cold_3();
        goto LAB_001876d7;
      }
      pcStack_3b0 = (code *)0x1875e5;
      iVar1 = uv_fs_poll_stop(unaff_R15);
      local_3a0 = (long)iVar1;
      local_398 = 0;
      if (local_3a0 != 0) {
        pcStack_3b0 = (code *)0x1876c8;
        run_test_fs_poll_close_request_multi_start_stop_cold_4();
        goto LAB_001876c8;
      }
      uVar3 = (int)unaff_RBP - 1;
      unaff_RBP = (ulong)uVar3;
    } while (uVar3 != 0);
    pcStack_3b0 = (code *)0x18761a;
    uv_close((uv_handle_t *)&local_390,close_cb);
    if (close_cb_called == 0) {
      unaff_RBX = (code *)&local_348;
      do {
        pcStack_3b0 = (code *)0x187636;
        uv_run((uv_loop_t *)unaff_RBX,UV_RUN_ONCE);
      } while (close_cb_called == 0);
    }
    local_3a0 = 1;
    local_398 = (long)close_cb_called;
    if (local_398 != 1) goto LAB_001876f5;
    unaff_RBX = (code *)&local_348;
    pcStack_3b0 = (code *)0x187676;
    uv_walk((uv_loop_t *)unaff_RBX,close_walk_cb,(void *)0x0);
    pcStack_3b0 = (code *)0x187680;
    uv_run((uv_loop_t *)unaff_RBX,UV_RUN_DEFAULT);
    local_3a0 = 0;
    pcStack_3b0 = (code *)0x187691;
    iVar1 = uv_loop_close((uv_loop_t *)unaff_RBX);
    local_398 = (long)iVar1;
    if (local_3a0 == local_398) {
      pcStack_3b0 = (code *)0x1876a9;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
LAB_001876d7:
    pcStack_3b0 = (code *)0x1876e6;
    run_test_fs_poll_close_request_multi_start_stop_cold_1();
LAB_001876e6:
    pcStack_3b0 = (code *)0x1876f5;
    run_test_fs_poll_close_request_multi_start_stop_cold_2();
LAB_001876f5:
    pcStack_3b0 = (code *)0x187704;
    run_test_fs_poll_close_request_multi_start_stop_cold_5();
  }
  pcStack_3b0 = run_test_fs_poll_close_request_multi_stop_start;
  run_test_fs_poll_close_request_multi_start_stop_cold_6();
  puStack_758 = (uv_loop_t *)0x18772c;
  puStack_3c8 = (uv_loop_t *)unaff_RBX;
  pcStack_3c0 = unaff_R14;
  puStack_3b8 = unaff_R15;
  pcStack_3b0 = (code *)unaff_RBP;
  remove("testfile");
  puStack_758 = (uv_loop_t *)0x187736;
  iVar1 = uv_loop_init((uv_loop_t *)(auStack_738 + 0x48));
  auStack_738._0_8_ = SEXT48(iVar1);
  lStack_748 = 0;
  if ((void *)auStack_738._0_8_ == (void *)0x0) {
    puStack_758 = (uv_loop_t *)0x187765;
    iVar1 = uv_fs_poll_init((uv_loop_t *)(auStack_738 + 0x48),(uv_fs_poll_t *)auStack_738);
    lStack_748 = (long)iVar1;
    lStack_740 = 0;
    if (lStack_748 != 0) goto LAB_001878d9;
    iVar1 = 10;
    unaff_RBX = (code *)auStack_738;
    do {
      lStack_748 = 0;
      lStack_740 = 0;
      puStack_758 = (uv_loop_t *)0x1877a5;
      iVar2 = uv_fs_poll_stop((uv_fs_poll_t *)unaff_RBX);
      lStack_748 = (long)iVar2;
      lStack_740 = 0;
      if (lStack_748 != 0) {
LAB_001878bb:
        puStack_758 = (uv_loop_t *)0x1878ca;
        run_test_fs_poll_close_request_multi_stop_start_cold_3();
        goto LAB_001878ca;
      }
      puStack_758 = (uv_loop_t *)0x1877d8;
      iVar2 = uv_fs_poll_start((uv_fs_poll_t *)unaff_RBX,poll_cb_fail,"testfile",100);
      lStack_748 = (long)iVar2;
      lStack_740 = 0;
      if (lStack_748 != 0) {
        puStack_758 = (uv_loop_t *)0x1878bb;
        run_test_fs_poll_close_request_multi_stop_start_cold_4();
        goto LAB_001878bb;
      }
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
    puStack_758 = (uv_loop_t *)0x18780d;
    uv_close((uv_handle_t *)auStack_738,close_cb);
    if (close_cb_called == 0) {
      unaff_RBX = (code *)(auStack_738 + 0x48);
      do {
        puStack_758 = (uv_loop_t *)0x187829;
        uv_run((uv_loop_t *)unaff_RBX,UV_RUN_ONCE);
      } while (close_cb_called == 0);
    }
    lStack_748 = 1;
    lStack_740 = (long)close_cb_called;
    if (lStack_740 != 1) goto LAB_001878e8;
    unaff_RBX = (code *)(auStack_738 + 0x48);
    puStack_758 = (uv_loop_t *)0x187869;
    uv_walk((uv_loop_t *)unaff_RBX,close_walk_cb,(void *)0x0);
    puStack_758 = (uv_loop_t *)0x187873;
    uv_run((uv_loop_t *)unaff_RBX,UV_RUN_DEFAULT);
    lStack_748 = 0;
    puStack_758 = (uv_loop_t *)0x187884;
    iVar1 = uv_loop_close((uv_loop_t *)unaff_RBX);
    lStack_740 = (long)iVar1;
    if (lStack_748 == lStack_740) {
      puStack_758 = (uv_loop_t *)0x18789c;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
LAB_001878ca:
    puStack_758 = (uv_loop_t *)0x1878d9;
    run_test_fs_poll_close_request_multi_stop_start_cold_1();
LAB_001878d9:
    puStack_758 = (uv_loop_t *)0x1878e8;
    run_test_fs_poll_close_request_multi_stop_start_cold_2();
LAB_001878e8:
    puStack_758 = (uv_loop_t *)0x1878f7;
    run_test_fs_poll_close_request_multi_stop_start_cold_5();
  }
  puStack_758 = (uv_loop_t *)run_test_fs_poll_close_request_stop_when_active;
  run_test_fs_poll_close_request_multi_stop_start_cold_6();
  puStack_758 = (uv_loop_t *)unaff_RBX;
  remove("testfile");
  iVar1 = uv_loop_init(&uStack_a80);
  uStack_ac8.data = (void *)(long)iVar1;
  if (uStack_ac8.data == (void *)0x0) {
    iVar1 = uv_fs_poll_init(&uStack_a80,&uStack_ac8);
    if (iVar1 != 0) goto LAB_00187a93;
    iVar1 = uv_fs_poll_start(&uStack_ac8,poll_cb_noop,"testfile",100);
    if (iVar1 != 0) goto LAB_00187aa0;
    uv_run(&uStack_a80,UV_RUN_ONCE);
    iVar1 = uv_fs_poll_stop(&uStack_ac8);
    if (iVar1 != 0) goto LAB_00187aad;
    uv_run(&uStack_a80,UV_RUN_ONCE);
    uv_close((uv_handle_t *)&uStack_ac8,close_cb);
    uv_run(&uStack_a80,UV_RUN_ONCE);
    if (close_cb_called == 1) {
      uv_walk(&uStack_a80,close_walk_cb,(void *)0x0);
      uv_run(&uStack_a80,UV_RUN_DEFAULT);
      iVar1 = uv_loop_close(&uStack_a80);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_00187ac7;
    }
  }
  else {
    run_test_fs_poll_close_request_stop_when_active_cold_1();
LAB_00187a93:
    run_test_fs_poll_close_request_stop_when_active_cold_2();
LAB_00187aa0:
    run_test_fs_poll_close_request_stop_when_active_cold_3();
LAB_00187aad:
    run_test_fs_poll_close_request_stop_when_active_cold_4();
  }
  run_test_fs_poll_close_request_stop_when_active_cold_5();
LAB_00187ac7:
  run_test_fs_poll_close_request_stop_when_active_cold_6();
  return extraout_EAX;
}

Assistant:

TEST_IMPL(fs_poll_close_request_multi_start_stop) {
  uv_loop_t loop;
  uv_fs_poll_t poll_handle;
  int i;

  remove(FIXTURE);

  ASSERT_OK(uv_loop_init(&loop));

  ASSERT_OK(uv_fs_poll_init(&loop, &poll_handle));

  for (i = 0; i < 10; ++i) {
    ASSERT_OK(uv_fs_poll_start(&poll_handle, poll_cb_fail, FIXTURE, 100));
    ASSERT_OK(uv_fs_poll_stop(&poll_handle));
  }
  uv_close((uv_handle_t*) &poll_handle, close_cb);
  while (close_cb_called == 0)
    uv_run(&loop, UV_RUN_ONCE);
  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(&loop);
  return 0;
}